

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> __thiscall
duckdb::RowGroup::AddColumn
          (RowGroup *this,RowGroupCollection *new_collection,ColumnDefinition *new_column,
          ExpressionExecutor *executor,Vector *result)

{
  BlockManager *block_manager;
  BlockManager *start_row;
  element_type *peVar1;
  ulong uVar2;
  undefined8 this_00;
  DataTableInfo *info;
  LogicalType *type;
  ColumnData *pCVar3;
  pointer pRVar4;
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
  *__x;
  ulong uVar5;
  Vector *in_R9;
  idx_t iVar6;
  idx_t i;
  ulong uVar7;
  shared_ptr<duckdb::ColumnData,_true> added_column;
  templated_unique_single_t *row_group;
  ColumnAppendState state;
  DataChunk dummy_chunk;
  undefined1 local_d8 [40];
  undefined1 local_b0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  reference<RowGroupCollection> rStack_90;
  atomic<duckdb::optional_ptr<duckdb::RowVersionManager,_true>_> local_88;
  element_type *peStack_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_70 [64];
  
  block_manager =
       (BlockManager *)
       ((new_collection->info).internal.
        super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
       _vptr__Sp_counted_base;
  local_d8._16_8_ = new_column;
  local_d8._24_8_ = this;
  local_d8._32_8_ = result;
  info = GetTableInfo((RowGroup *)new_collection);
  start_row = new_collection->block_manager;
  peVar1 = (new_collection->row_groups).internal.
           super___shared_ptr<duckdb::RowGroupSegmentTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar6 = new_collection->row_start;
  type = ColumnDefinition::Type((ColumnDefinition *)executor);
  ColumnData::CreateColumn
            ((ColumnData *)local_d8,block_manager,info,(long)((long)peVar1 - iVar6) >> 4,
             (idx_t)start_row,type,(optional_ptr<duckdb::ColumnData,_true>)0x0);
  uVar2 = new_collection->row_group_size;
  if (uVar2 != 0) {
    DataChunk::DataChunk((DataChunk *)local_70);
    local_88._M_i.ptr = (optional_ptr<duckdb::RowVersionManager,_true>)(RowVersionManager *)0x0;
    peStack_80 = (element_type *)0x0;
    local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    rStack_90._M_data = (RowGroupCollection *)0x0;
    local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pCVar3 = shared_ptr<duckdb::ColumnData,_true>::operator->
                       ((shared_ptr<duckdb::ColumnData,_true> *)local_d8);
    (*pCVar3->_vptr_ColumnData[0x11])(pCVar3,local_b0 + 0x10);
    uVar5 = uVar2;
    for (uVar7 = 0; uVar7 < uVar2; uVar7 = uVar7 + 0x800) {
      iVar6 = 0x800;
      if (uVar5 < 0x800) {
        iVar6 = uVar5;
      }
      local_70._24_8_ = iVar6;
      ExpressionExecutor::ExecuteExpression
                ((ExpressionExecutor *)local_d8._32_8_,(DataChunk *)local_70,in_R9);
      pCVar3 = shared_ptr<duckdb::ColumnData,_true>::operator->
                         ((shared_ptr<duckdb::ColumnData,_true> *)local_d8);
      ColumnData::Append(pCVar3,(ColumnAppendState *)(local_b0 + 0x10),in_R9,iVar6);
      uVar5 = uVar5 - 0x800;
    }
    ColumnAppendState::~ColumnAppendState((ColumnAppendState *)(local_b0 + 0x10));
    DataChunk::~DataChunk((DataChunk *)local_70);
  }
  this_00 = local_d8._24_8_;
  make_uniq<duckdb::RowGroup,duckdb::RowGroupCollection&,unsigned_long&,std::atomic<unsigned_long>&>
            ((duckdb *)local_d8._24_8_,(RowGroupCollection *)local_d8._16_8_,
             (unsigned_long *)new_collection,
             (atomic<unsigned_long> *)&new_collection->row_group_size);
  pRVar4 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                      this_00);
  GetOrCreateVersionInfoPtr((RowGroup *)local_b0);
  SetVersionInfo(pRVar4,(shared_ptr<duckdb::RowVersionManager,_true> *)local_b0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
  __x = &GetColumns((RowGroup *)new_collection)->
         super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
  ;
  pRVar4 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                      this_00);
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
  ::operator=(&(pRVar4->columns).
               super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
              ,__x);
  pRVar4 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                     ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                      this_00);
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::ColumnData,true>>
            ((vector<duckdb::shared_ptr<duckdb::ColumnData,true>,std::allocator<duckdb::shared_ptr<duckdb::ColumnData,true>>>
              *)&pRVar4->columns,(shared_ptr<duckdb::ColumnData,_true> *)local_d8);
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
            ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)this_00);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  return (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)
         (_Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>)this_00;
}

Assistant:

unique_ptr<RowGroup> RowGroup::AddColumn(RowGroupCollection &new_collection, ColumnDefinition &new_column,
                                         ExpressionExecutor &executor, Vector &result) {
	Verify();

	// construct a new column data for the new column
	auto added_column =
	    ColumnData::CreateColumn(GetBlockManager(), GetTableInfo(), GetColumnCount(), start, new_column.Type());

	idx_t rows_to_write = this->count;
	if (rows_to_write > 0) {
		DataChunk dummy_chunk;

		ColumnAppendState state;
		added_column->InitializeAppend(state);
		for (idx_t i = 0; i < rows_to_write; i += STANDARD_VECTOR_SIZE) {
			idx_t rows_in_this_vector = MinValue<idx_t>(rows_to_write - i, STANDARD_VECTOR_SIZE);
			dummy_chunk.SetCardinality(rows_in_this_vector);
			executor.ExecuteExpression(dummy_chunk, result);
			added_column->Append(state, result, rows_in_this_vector);
		}
	}

	// set up the row_group based on this row_group
	auto row_group = make_uniq<RowGroup>(new_collection, this->start, this->count);
	row_group->SetVersionInfo(GetOrCreateVersionInfoPtr());
	row_group->columns = GetColumns();
	// now add the new column
	row_group->columns.push_back(std::move(added_column));

	row_group->Verify();
	return row_group;
}